

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

bool __thiscall
cfd::TransactionContext::IsFindTxOut
          (TransactionContext *this,Script *locking_script,uint32_t *index,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indexes)

{
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  uint32_t uVar4;
  pointer puVar5;
  bool bVar6;
  uint local_74;
  uint *local_70;
  Script local_68;
  
  if (indexes == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    uVar4 = (**(code **)(*(long *)this + 0x18))(this,locking_script);
    bVar6 = true;
    if (index != (uint32_t *)0x0) {
      *index = uVar4;
    }
  }
  else {
    local_70 = index;
    for (local_74 = 0;
        local_74 < (uint)((*(long *)&this->field_0x30 - *(long *)&this->field_0x28) / 0x50);
        local_74 = local_74 + 1) {
      cfd::core::AbstractTxOut::GetLockingScript();
      cVar3 = cfd::core::Script::Equals(locking_script);
      core::Script::~Script(&local_68);
      if (cVar3 != '\0') {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)indexes,&local_74);
      }
    }
    puVar1 = (indexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (indexes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = puVar2;
    if ((local_70 != (uint *)0x0) && (puVar5 = puVar1, puVar1 != puVar2)) {
      *local_70 = *puVar1;
      puVar5 = puVar2;
    }
    bVar6 = puVar1 != puVar5;
  }
  return bVar6;
}

Assistant:

bool TransactionContext::IsFindTxOut(
    const Script& locking_script, uint32_t* index,
    std::vector<uint32_t>* indexes) const {
  if (indexes != nullptr) {
    for (uint32_t idx = 0; idx < static_cast<uint32_t>(vout_.size()); ++idx) {
      if (locking_script.Equals(vout_[idx].GetLockingScript())) {
        indexes->emplace_back(idx);
      }
    }
    if ((index != nullptr) && (!indexes->empty())) *index = (*indexes)[0];
    return !indexes->empty();
  }
  try {
    uint32_t temp_index = GetTxOutIndex(locking_script);
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    if (except.GetErrorCode() == CfdError::kCfdIllegalArgumentError) {
      return false;
    } else {
      throw except;
    }
  }
}